

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.hpp
# Opt level: O0

void __thiscall
ableton::link::
Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>
::ImplDeleter::operator()(ImplDeleter *this)

{
  element_type *peVar1;
  ImplDeleter *this_local;
  
  peVar1 = std::
           __shared_ptr_access<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  if ((peVar1->mSuccess & 1U) == 0) {
    peVar1 = std::
             __shared_ptr_access<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>
    ::Impl::fail(peVar1);
  }
  std::
  __shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ::reset((__shared_ptr<ableton::link::Measurement<ableton::platforms::asio::AsioService,_ableton::platforms::linux::Clock<1>,_ableton::discovery::Socket<512UL>,_ableton::util::NullLog>::Impl,_(__gnu_cxx::_Lock_policy)2>
           *)this);
  return;
}

Assistant:

void operator()()
    {
      // Notify callback that the measurement has failed if it did
      // not succeed before destruction
      if (!mpImpl->mSuccess)
      {
        mpImpl->fail();
      }
      mpImpl.reset();
    }